

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_function_helper
          (xpath_parser *this,ast_type_t type0,ast_type_t type1,size_t argc,xpath_ast_node **args)

{
  xpath_lexer_string *pxVar1;
  byte bVar2;
  lexeme_t lVar3;
  lexeme_t lVar4;
  bool bVar5;
  bool bVar6;
  nodetest_t nVar7;
  xpath_ast_node *pxVar8;
  char_t *pcVar9;
  xpath_ast_node *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_ast_node **ppxVar12;
  char cVar13;
  xpath_parser *this_00;
  char cVar14;
  char *pcVar15;
  char *pcVar16;
  xpath_ast_node *pxVar17;
  xpath_parser *pxStack_78;
  xpath_lexer_string xStack_70;
  xpath_lexer_string *pxStack_60;
  xpath_ast_node **ppxStack_58;
  
  if ((argc != 1) || ((*args)->_rettype == '\x01')) {
    pxVar8 = (xpath_ast_node *)alloc_node(this);
    cVar13 = (char)type1;
    if (argc == 0) {
      cVar13 = (char)type0;
    }
    pxVar17 = *args;
    pxVar8->_type = cVar13;
    pxVar8->_rettype = '\x03';
    pxVar8->_axis = '\0';
    pxVar8->_test = '\0';
    pxVar8->_left = pxVar17;
    pxVar8->_right = (xpath_ast_node *)0x0;
    pxVar8->_next = (xpath_ast_node *)0x0;
    return pxVar8;
  }
  pcVar15 = "Function has to be applied to node set";
  throw_error(this,"Function has to be applied to node set");
  ppxStack_58 = args;
  if (((xpath_ast_node *)pcVar15 == (xpath_ast_node *)0x0) ||
     (this_00 = this, ((xpath_ast_node *)pcVar15)->_rettype == '\x01')) {
    this_00 = (xpath_parser *)&this->_lexer;
    lVar3 = (this->_lexer)._cur_lexeme;
    if (lVar3 == lex_double_dot) {
      xpath_lexer::next((xpath_lexer *)this_00);
      pxVar8 = (xpath_ast_node *)alloc_node(this);
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = '\t';
      pxVar8->_test = '\x02';
LAB_0011f911:
      pxVar8->_left = (xpath_ast_node *)pcVar15;
      pxVar8->_right = (xpath_ast_node *)0x0;
      pxVar8->_next = (xpath_ast_node *)0x0;
      (pxVar8->_data).string = (char_t *)0x0;
      return pxVar8;
    }
    if (lVar3 == lex_dot) {
      xpath_lexer::next((xpath_lexer *)this_00);
      pxVar8 = (xpath_ast_node *)alloc_node(this);
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = '\f';
      pxVar8->_test = '\x02';
      goto LAB_0011f911;
    }
    pcVar16 = pcVar15;
    if (lVar3 != lex_axis_attribute) {
      cVar13 = '\x03';
    }
    else {
      xpath_lexer::next((xpath_lexer *)this_00);
      cVar13 = '\x02';
    }
    xStack_70.begin = (char_t *)0x0;
    xStack_70.end = (char_t *)0x0;
    lVar4 = (this->_lexer)._cur_lexeme;
    pxStack_78 = this;
    if (lVar4 == lex_multiply) {
      xpath_lexer::next((xpath_lexer *)this_00);
      cVar14 = '\a';
LAB_0011fcd7:
      pxVar8 = (xpath_ast_node *)alloc_node(this);
      pcVar9 = alloc_string(this,&xStack_70);
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = cVar13;
      pxVar8->_test = cVar14;
      pxVar8->_left = (xpath_ast_node *)pcVar15;
      pxVar8->_right = (xpath_ast_node *)0x0;
      pxVar8->_next = (xpath_ast_node *)0x0;
      (pxVar8->_data).string = pcVar9;
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        return pxVar8;
      }
      pxVar17 = (xpath_ast_node *)0x0;
      while( true ) {
        xpath_lexer::next((xpath_lexer *)this_00);
        pxVar10 = parse_expression(this);
        pxVar11 = (xpath_ast_node *)alloc_node(this);
        pxVar11->_type = '\x0f';
        pxVar11->_rettype = '\x01';
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
        pxVar11->_left = pxVar10;
        pxVar11->_right = (xpath_ast_node *)0x0;
        pxVar11->_next = (xpath_ast_node *)0x0;
        if ((this->_lexer)._cur_lexeme != lex_close_square_brace) break;
        xpath_lexer::next((xpath_lexer *)this_00);
        ppxVar12 = &pxVar17->_next;
        if (pxVar17 == (xpath_ast_node *)0x0) {
          ppxVar12 = &pxVar8->_right;
        }
        *ppxVar12 = pxVar11;
        pxVar17 = pxVar11;
        if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
          return pxVar8;
        }
      }
      throw_error(this,"Unmatched square brace");
      goto LAB_0011fdab;
    }
    if (lVar4 == lex_string) {
      pxVar1 = &(this->_lexer)._cur_lexeme_contents;
      xStack_70.begin = (this->_lexer)._cur_lexeme_contents.begin;
      xStack_70.end = (this->_lexer)._cur_lexeme_contents.end;
      xpath_lexer::next((xpath_lexer *)this_00);
      pxStack_60 = pxVar1;
      if ((this->_lexer)._cur_lexeme == lex_double_colon) {
        if (lVar3 == lex_axis_attribute) {
          pcVar15 = "Two axis specifiers in one step";
          goto LAB_0011fdd3;
        }
        bVar2 = *(byte *)(xpath_memory_block **)xStack_70.begin;
        if (bVar2 < 0x6e) {
          switch(bVar2) {
          case 0x61:
            pcVar16 = "ancestor";
            bVar5 = xpath_lexer_string::operator==(&xStack_70,"ancestor");
            cVar13 = '\0';
            bVar6 = true;
            if (!bVar5) {
              pcVar16 = "ancestor-or-self";
              bVar5 = xpath_lexer_string::operator==(&xStack_70,"ancestor-or-self");
              cVar13 = '\x01';
              if (!bVar5) {
                pcVar16 = "attribute";
                bVar5 = xpath_lexer_string::operator==(&xStack_70,"attribute");
                cVar13 = '\x02';
                goto LAB_0011fb6b;
              }
            }
            break;
          default:
            goto switchD_0011f9b5_caseD_62;
          case 99:
            pcVar16 = "child";
            bVar6 = xpath_lexer_string::operator==(&xStack_70,"child");
            if (!bVar6) goto switchD_0011f9b5_caseD_62;
            cVar13 = '\x03';
LAB_0011fb19:
            bVar6 = true;
            break;
          case 100:
            pcVar16 = "descendant";
            bVar5 = xpath_lexer_string::operator==(&xStack_70,"descendant");
            cVar13 = '\x04';
            bVar6 = true;
            if (!bVar5) {
              pcVar16 = "descendant-or-self";
              bVar5 = xpath_lexer_string::operator==(&xStack_70,"descendant-or-self");
              cVar13 = '\x05';
LAB_0011fb6b:
              bVar6 = true;
              if (bVar5 == false) goto switchD_0011f9b5_caseD_62;
            }
            break;
          case 0x66:
            pcVar16 = "following";
            bVar5 = xpath_lexer_string::operator==(&xStack_70,"following");
            cVar13 = '\x06';
            bVar6 = true;
            if (!bVar5) {
              pcVar16 = "following-sibling";
              bVar5 = xpath_lexer_string::operator==(&xStack_70,"following-sibling");
              cVar13 = '\a';
              goto LAB_0011fb6b;
            }
          }
        }
        else {
          if (bVar2 == 0x6e) {
            pcVar16 = "namespace";
            bVar6 = xpath_lexer_string::operator==(&xStack_70,"namespace");
            if (bVar6) {
              cVar13 = '\b';
              goto LAB_0011fb19;
            }
          }
          else {
            if (bVar2 == 0x70) {
              pcVar16 = "parent";
              bVar5 = xpath_lexer_string::operator==(&xStack_70,"parent");
              cVar13 = '\t';
              bVar6 = true;
              if (!bVar5) {
                pcVar16 = "preceding";
                bVar5 = xpath_lexer_string::operator==(&xStack_70,"preceding");
                cVar13 = '\n';
                if (!bVar5) {
                  pcVar16 = "preceding-sibling";
                  bVar5 = xpath_lexer_string::operator==(&xStack_70,"preceding-sibling");
                  cVar13 = '\v';
                  goto LAB_0011fb6b;
                }
              }
              goto LAB_0011fb76;
            }
            if (bVar2 == 0x73) {
              pcVar16 = "self";
              bVar6 = xpath_lexer_string::operator==(&xStack_70,"self");
              if (bVar6) {
                cVar13 = '\f';
                goto LAB_0011fb19;
              }
            }
          }
switchD_0011f9b5_caseD_62:
          cVar13 = '\x03';
          bVar6 = false;
        }
LAB_0011fb76:
        if (!bVar6) {
          pcVar15 = "Unknown axis";
          goto LAB_0011fdd3;
        }
        xpath_lexer::next((xpath_lexer *)this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
        if (lVar3 == lex_string) {
          xStack_70.begin = pxVar1->begin;
          xStack_70.end = (this->_lexer)._cur_lexeme_contents.end;
          cVar14 = '\0';
          bVar6 = true;
        }
        else {
          if (lVar3 != lex_multiply) goto LAB_0011fdba;
          xStack_70.begin = (char_t *)0x0;
          xStack_70.end = (char_t *)0x0;
          cVar14 = '\a';
          bVar6 = false;
        }
        xpath_lexer::next((xpath_lexer *)this_00);
      }
      else {
        cVar14 = '\0';
        bVar6 = true;
      }
      if (bVar6) {
        if ((this->_lexer)._cur_lexeme == lex_open_brace) {
          xpath_lexer::next((xpath_lexer *)this_00);
          lVar3 = (this->_lexer)._cur_lexeme;
          if (lVar3 == lex_close_brace) {
            xpath_lexer::next((xpath_lexer *)this_00);
            nVar7 = parse_node_test_type((xpath_parser *)&xStack_70,(xpath_lexer_string *)pcVar16);
            if (nVar7 == nodetest_none) goto LAB_0011fddd;
            xStack_70.begin = (char_t *)0x0;
            xStack_70.end = (char_t *)0x0;
          }
          else {
            bVar6 = xpath_lexer_string::operator==(&xStack_70,"processing-instruction");
            if (!bVar6) {
              pcVar15 = "Unmatched brace near node type test";
              goto LAB_0011fdd3;
            }
            if (lVar3 != lex_quoted_string) {
              pcVar15 = "Only literals are allowed as arguments to processing-instruction()";
              goto LAB_0011fdd3;
            }
            lVar3 = (this->_lexer)._cur_lexeme;
            if ((lex_string < lVar3) ||
               ((0x10c800U >> (lVar3 & (lex_double_dot|lex_plus)) & 1) == 0)) {
              __assert_fail("_cur_lexeme == lex_var_ref || _cur_lexeme == lex_number || _cur_lexeme == lex_string || _cur_lexeme == lex_quoted_string"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                            ,0x1c69,
                            "const xpath_lexer_string &pugi::impl::(anonymous namespace)::xpath_lexer::contents() const"
                           );
            }
            xStack_70.begin = pxStack_60->begin;
            xStack_70.end = pxStack_60->end;
            xpath_lexer::next((xpath_lexer *)this_00);
            if ((this->_lexer)._cur_lexeme != lex_close_brace) {
              pcVar15 = "Unmatched brace near processing-instruction()";
              goto LAB_0011fdd3;
            }
            xpath_lexer::next((xpath_lexer *)this_00);
            nVar7 = nodetest_pi;
          }
          cVar14 = (char)nVar7;
        }
        else {
          cVar14 = '\x01';
          if (((2 < (long)xStack_70.end - (long)xStack_70.begin) && (xStack_70.end[-2] == ':')) &&
             (xStack_70.end[-1] == '*')) {
            xStack_70.end = xStack_70.end + -1;
            cVar14 = '\b';
          }
        }
      }
      goto LAB_0011fcd7;
    }
  }
  else {
LAB_0011fdab:
    throw_error(this_00,"Step has to be applied to node set");
  }
LAB_0011fdba:
  pcVar15 = "Unrecognized node test";
LAB_0011fdd3:
  do {
    throw_error(pxStack_78,pcVar15);
LAB_0011fddd:
    pcVar15 = "Unrecognized node type";
  } while( true );
}

Assistant:

xpath_ast_node* parse_function_helper(ast_type_t type0, ast_type_t type1, size_t argc, xpath_ast_node* args[2])
		{
			assert(argc <= 1);

			if (argc == 1 && args[0]->rettype() != xpath_type_node_set) throw_error("Function has to be applied to node set");

			return new (alloc_node()) xpath_ast_node(argc == 0 ? type0 : type1, xpath_type_string, args[0]);
		}